

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

int allBytesIdentical(void *src,size_t srcSize)

{
  size_t sVar1;
  
  if (srcSize == 0) {
    __assert_fail("srcSize >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4a3d,"int allBytesIdentical(const void *, size_t)");
  }
  if (src != (void *)0x0) {
    if (srcSize != 1) {
      sVar1 = 1;
      do {
        if (*(char *)((long)src + sVar1) != *src) {
          return 0;
        }
        sVar1 = sVar1 + 1;
      } while (srcSize != sVar1);
    }
    return 1;
  }
  __assert_fail("src != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x4a3e,"int allBytesIdentical(const void *, size_t)");
}

Assistant:

static int allBytesIdentical(const void* src, size_t srcSize)
{
    assert(srcSize >= 1);
    assert(src != NULL);
    {   const BYTE b = ((const BYTE*)src)[0];
        size_t p;
        for (p=1; p<srcSize; p++) {
            if (((const BYTE*)src)[p] != b) return 0;
        }
        return 1;
    }
}